

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O2

Rule * __thiscall BindingEnv::LookupRuleCurrentScope(BindingEnv *this,string *rule_name)

{
  iterator iVar1;
  Rule *pRVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
          ::find(&(this->rules_)._M_t,rule_name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->rules_)._M_t._M_impl.super__Rb_tree_header) {
    pRVar2 = (Rule *)0x0;
  }
  else {
    pRVar2 = *(Rule **)(iVar1._M_node + 2);
  }
  return pRVar2;
}

Assistant:

const Rule* BindingEnv::LookupRuleCurrentScope(const string& rule_name) {
  map<string, const Rule*>::iterator i = rules_.find(rule_name);
  if (i == rules_.end())
    return NULL;
  return i->second;
}